

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O0

void ReleaseHull(PHullResult *result)

{
  int iVar1;
  undefined4 *in_RDI;
  
  iVar1 = btAlignedObjectArray<unsigned_int>::size
                    ((btAlignedObjectArray<unsigned_int> *)(in_RDI + 6));
  if (iVar1 != 0) {
    btAlignedObjectArray<unsigned_int>::clear((btAlignedObjectArray<unsigned_int> *)result);
  }
  *in_RDI = 0;
  in_RDI[1] = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  return;
}

Assistant:

void ReleaseHull(PHullResult &result)
{
	if ( result.m_Indices.size() )
	{
		result.m_Indices.clear();
	}

	result.mVcount = 0;
	result.mIndexCount = 0;
	result.mVertices = 0;
}